

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

void * KINCreate(void)

{
  realtype rVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)calloc(1,0x280);
  if (puVar2 == (undefined8 *)0x0) {
    KINProcessError((KINMem)0x0,0,"KINSOL","KINCreate","A memory request failed.");
  }
  else {
    *puVar2 = 0x3cb0000000000000;
    puVar2[0x4a] = KINErrHandler;
    puVar2[0x4b] = puVar2;
    puVar2[0x4c] = _stderr;
    puVar2[0x4d] = KINInfoHandler;
    puVar2[0x4e] = puVar2;
    puVar2[0x4f] = _stdout;
    puVar2[6] = 200;
    puVar2[7] = 10;
    puVar2[8] = 5;
    puVar2[9] = 10;
    puVar2[0x18] = 0x4000000000000000;
    puVar2[0x10] = 0x3e50000000000000;
    rVar1 = SUNRpowerR(2.220446049250313e-16,0.6666666666666667);
    puVar2[4] = rVar1;
    rVar1 = SUNRpowerR(2.220446049250313e-16,0.3333333333333333);
    puVar2[3] = rVar1;
    *(undefined4 *)(puVar2 + 10) = 1;
    puVar2[0x16] = 0x4000000000000000;
    puVar2[0x14] = 0x3fb999999999999a;
    puVar2[0x15] = 0x3feccccccccccccd;
    *(undefined4 *)(puVar2 + 0x49) = 0;
    *(undefined4 *)(puVar2 + 0x45) = 1;
    *(undefined4 *)(puVar2 + 0x46) = 0;
    *(undefined4 *)((long)puVar2 + 0x234) = 0;
    *(undefined4 *)(puVar2 + 0x47) = 0x88e368f1;
    *(undefined4 *)((long)puVar2 + 0x23c) = 0x3ee4f8b5;
    puVar2[0x48] = 0x3feccccccccccccd;
    puVar2[0x38] = 0x11;
    puVar2[0x39] = 0x16;
    puVar2[0x36] = 0;
    puVar2[0x37] = 0;
  }
  return puVar2;
}

Assistant:

void *KINCreate(void)
{
  KINMem kin_mem;
  realtype uround;
 
  kin_mem = NULL;
  kin_mem = (KINMem) malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL) {
    KINProcessError(kin_mem, 0, "KINSOL", "KINCreate", MSG_MEM_FAIL);
    return(NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = UNIT_ROUNDOFF;
  
  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_m_aa             = ZERO;
  kin_mem->kin_aamem_aa         = 0;
  kin_mem->kin_setstop_aa       = 0;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ehfun            = KINErrHandler;
  kin_mem->kin_eh_data          = kin_mem;
  kin_mem->kin_errfp            = stderr;
  kin_mem->kin_ihfun            = KINInfoHandler;
  kin_mem->kin_ih_data          = kin_mem;
  kin_mem->kin_infofp           = stdout;
  kin_mem->kin_printfl          = PRINTFL_DEFAULT;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround,TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround,ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1;     /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;        /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9;     /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO;       /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return((void *) kin_mem);
}